

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O3

void generate_states(void)

{
  int iVar1;
  
  allocate_storage();
  itemset = (Yshort *)allocate(nitems << 2);
  iVar1 = nrules + 0x3e;
  if (-1 < nrules + 0x1f) {
    iVar1 = nrules + 0x1f;
  }
  ruleset = (uint *)allocate((iVar1 >> 5) << 2);
  set_first_derives();
  initialize_states();
  for (; this_state != (core *)0x0; this_state = this_state->next) {
    closure(this_state->items,this_state->nitems);
    save_reductions();
    new_itemsets();
    append_states();
    if (0 < nshifts) {
      save_shifts();
    }
  }
  finalize_closure();
  free_storage();
  return;
}

Assistant:

void generate_states()
{
    allocate_storage();
    itemset = NEW2(nitems, Yshort);
    ruleset = NEW2(WORDSIZE(nrules), unsigned);
    set_first_derives();
    initialize_states();

    while (this_state)
    {
	closure(this_state->items, this_state->nitems);
	save_reductions();
	new_itemsets();
	append_states();

	if (nshifts > 0)
	    save_shifts();

	this_state = this_state->next;
    }

    finalize_closure();
    free_storage();
}